

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O0

void nh_lib_init(nh_window_procs *procs,char **paths)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  bool bVar4;
  int local_1c;
  int i;
  char **paths_local;
  nh_window_procs *procs_local;
  
  iVar3 = exit_jmp_buf_valid + 1;
  bVar4 = exit_jmp_buf_valid != 0;
  exit_jmp_buf_valid = iVar3;
  if ((bVar4) || (iVar3 = __sigsetjmp(exit_jmp_buf,1), iVar3 == 0)) {
    memcpy(&windowprocs,procs,0x90);
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      pcVar1 = strdup(paths[local_1c]);
      fqn_prefix[local_1c] = pcVar1;
    }
    u.uhp = 1;
    init_opt_struct();
    turntime = 0;
    lVar2 = get_tz_offset();
    current_timezone = (int)lVar2;
    exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
  }
  return;
}

Assistant:

void nh_lib_init(const struct nh_window_procs *procs, char **paths)
{
    int i;
            
    if (!api_entry_checkpoint()) /* not sure anything in here can actually call panic */
	return;
    
    windowprocs = *procs;
    
    for (i = 0; i < PREFIX_COUNT; i++)
	fqn_prefix[i] = strdup(paths[i]);
    
    u.uhp = 1;	/* prevent RIP on early quits */
    init_opt_struct();
    turntime = 0;
    
    current_timezone = get_tz_offset();
    
    api_exit();
}